

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

void __thiscall bsplib::exception::exception(exception *this,exception *e)

{
  string local_38 [32];
  exception *local_18;
  exception *e_local;
  exception *this_local;
  
  local_18 = e;
  e_local = this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__exception_0013fd28;
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_stream,local_38,0x10);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::string((string *)&this->m_buf);
  return;
}

Assistant:

exception( const exception & e )
      : m_stream( e.m_stream.str() )
      , m_buf( )
    {}